

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderHeatmap<unsigned_char,ImPlot::TransformerLinLin>
               (TransformerLinLin transformer,ImDrawList *DrawList,uchar *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max,bool reverse_y)

{
  byte bVar1;
  float fVar2;
  ImPlotPlot *pIVar3;
  ImVec2 IVar4;
  uchar *puVar5;
  byte bVar6;
  ImU32 col;
  ImPlotContext *gp;
  byte bVar7;
  ImPlotPoint *pIVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar14;
  double dVar15;
  double dVar16;
  ImVec4 IVar17;
  ImVec2 b;
  GetterHeatmap<unsigned_char> getter;
  ImVec2 local_168;
  double local_160;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  undefined1 local_148 [16];
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  long local_118;
  long local_110;
  ulong local_108;
  double local_100;
  double local_f8;
  ImDrawList *local_f0;
  uchar *local_e8;
  double local_e0;
  RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLinLin> local_d8;
  GetterHeatmap<unsigned_char> local_b8;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if ((((scale_min == 0.0) && (!NAN(scale_min))) && (scale_max == 0.0)) && (!NAN(scale_max))) {
    bVar6 = *values;
    bVar7 = bVar6;
    if (1 < cols * rows) {
      uVar11 = 1;
      do {
        bVar1 = values[uVar11];
        if (bVar1 < bVar7) {
          bVar7 = bVar1;
        }
        if (bVar6 < bVar1) {
          bVar6 = bVar1;
        }
        uVar11 = uVar11 + 1;
      } while ((uint)(cols * rows) != uVar11);
    }
    scale_min = (double)bVar7;
    scale_max = (double)bVar6;
  }
  if ((scale_min != scale_max) || (NAN(scale_min) || NAN(scale_max))) {
    if (reverse_y) {
      dVar15 = -1.0;
      pIVar8 = bounds_max;
    }
    else {
      dVar15 = 1.0;
      pIVar8 = bounds_min;
    }
    local_128 = pIVar8->y;
    local_b8.XRef = bounds_min->x;
    local_160 = (double)cols;
    dVar16 = (double)rows;
    local_b8.Width = (bounds_max->x - local_b8.XRef) / local_160;
    local_148._8_8_ = local_148._0_8_;
    local_148._0_8_ = dVar16;
    local_b8.Height = (bounds_max->y - bounds_min->y) / dVar16;
    local_b8.Count = cols * rows;
    local_b8.HalfSize.x = local_b8.Width * 0.5;
    local_b8.HalfSize.y = local_b8.Height * 0.5;
    pIVar3 = GImPlot->CurrentPlot;
    fVar2 = (float)pIVar3->CurrentYAxis;
    local_b8.Values = values;
    local_b8.Rows = rows;
    local_b8.Cols = cols;
    local_b8.ScaleMin = scale_min;
    local_b8.ScaleMax = scale_max;
    local_b8.YRef = local_128;
    local_b8.YDir = dVar15;
    switch(GImPlot->Scales[(int)fVar2]) {
    case 0:
      local_d8.Transformer = (TransformerLinLin *)&local_168;
      local_168.x = fVar2;
      local_d8.Getter = &local_b8;
      local_d8.Prims = local_b8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLinLin>>
                (&local_d8,DrawList,&pIVar3->PlotRect);
      dVar16 = (double)local_148._0_8_;
      break;
    case 1:
      local_d8.Transformer = (TransformerLinLin *)&local_168;
      local_168.x = fVar2;
      local_d8.Getter = &local_b8;
      local_d8.Prims = local_b8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLogLin>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLogLin> *)
                 &local_d8,DrawList,&pIVar3->PlotRect);
      dVar16 = (double)local_148._0_8_;
      break;
    case 2:
      local_d8.Transformer = (TransformerLinLin *)&local_168;
      local_168.x = fVar2;
      local_d8.Getter = &local_b8;
      local_d8.Prims = local_b8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLinLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLinLog> *)
                 &local_d8,DrawList,&pIVar3->PlotRect);
      dVar16 = (double)local_148._0_8_;
      break;
    case 3:
      local_d8.Transformer = (TransformerLinLin *)&local_168;
      local_168.x = fVar2;
      local_d8.Getter = &local_b8;
      local_d8.Prims = local_b8.Count;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,ImPlot::TransformerLogLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLogLog> *)
                 &local_d8,DrawList,&pIVar3->PlotRect);
      dVar16 = (double)local_148._0_8_;
    }
    local_148._0_8_ = dVar16;
    if ((fmt != (char *)0x0) && (0 < rows)) {
      dVar16 = (bounds_max->x - bounds_min->x) / local_160;
      local_130 = (bounds_max->y - bounds_min->y) / (double)local_148._0_8_;
      lVar9 = (long)transformer.YAxis;
      local_108 = (ulong)(uint)cols;
      local_138 = local_130 * 0.5;
      dVar14 = dVar16 * 0.5;
      lVar12 = lVar9 << 4;
      local_120 = 0.0;
      local_14c = 0;
      local_150 = 0;
      lVar10 = lVar9;
      local_158 = rows;
      local_154 = cols;
      local_118 = lVar12;
      local_110 = lVar9;
      local_100 = dVar14;
      local_f8 = dVar16;
      local_f0 = DrawList;
      do {
        if (0 < cols) {
          local_e0 = (local_130 * local_120 + local_138) * dVar15 + local_128;
          local_e8 = values + local_150;
          local_160 = 0.0;
          lVar13 = 0;
          do {
            puVar5 = local_e8;
            local_148 = ZEXT416((uint)(float)(((local_160 * dVar16 + bounds_min->x + dVar14) -
                                              (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx
                                             + (double)*(float *)((long)&GImPlot->PixelRange[0].Min.
                                                                         x + lVar12)));
            local_48 = ZEXT416((uint)(float)((local_e0 -
                                             GImPlot->CurrentPlot->YAxis[lVar9].Range.Min) *
                                             GImPlot->My[lVar10] +
                                            (double)*(float *)((long)&GImPlot->PixelRange[0].Min.y +
                                                              lVar12)));
            sprintf((char *)&local_d8,fmt,(ulong)local_e8[lVar13]);
            IVar4 = ImGui::CalcTextSize((char *)&local_d8,(char *)0x0,false,-1.0);
            local_58._8_4_ = extraout_XMM0_Dc;
            local_58._0_4_ = IVar4.x;
            local_58._4_4_ = IVar4.y;
            local_58._12_4_ = extraout_XMM0_Dd;
            dVar16 = ((double)puVar5[lVar13] - scale_min) / (scale_max - scale_min);
            dVar14 = 1.0;
            if (dVar16 <= 1.0) {
              dVar14 = dVar16;
            }
            IVar17 = SampleColormap((float)(double)(~-(ulong)(dVar16 < 0.0) & (ulong)dVar14),-1);
            local_168.x = (float)local_148._0_4_ - (float)local_58._0_4_ * 0.5;
            local_168.y = (float)local_48._0_4_ - (float)local_58._4_4_ * 0.5;
            ImDrawList::AddText(local_f0,&local_168,
                                -(uint)(IVar17.z * 0.114 + IVar17.x * 0.299 + IVar17.y * 0.587 <=
                                       0.5) | 0xff000000,(char *)&local_d8,(char *)0x0);
            local_160 = local_160 + 1.0;
            lVar13 = lVar13 + 1;
            lVar10 = local_110;
            lVar12 = local_118;
            dVar16 = local_f8;
            dVar14 = local_100;
          } while ((int)local_108 != (int)lVar13);
          local_150 = local_150 + (int)lVar13;
          rows = local_158;
          cols = local_154;
        }
        local_120 = local_120 + 1.0;
        local_14c = local_14c + 1;
      } while (local_14c != rows);
    }
  }
  else {
    pIVar3 = GImPlot->CurrentPlot;
    dVar15 = (pIVar3->XAxis).Range.Min;
    local_b8.Values =
         (uchar *)CONCAT44((float)((bounds_min->y - pIVar3->YAxis[transformer.YAxis].Range.Min) *
                                   GImPlot->My[transformer.YAxis] +
                                  (double)GImPlot->PixelRange[transformer.YAxis].Min.y),
                           (float)((bounds_min->x - dVar15) * GImPlot->Mx +
                                  (double)GImPlot->PixelRange[transformer.YAxis].Min.x));
    local_d8.Getter =
         (GetterHeatmap<unsigned_char> *)
         CONCAT44((float)((bounds_max->y - pIVar3->YAxis[transformer.YAxis].Range.Min) *
                          GImPlot->My[transformer.YAxis] +
                         (double)GImPlot->PixelRange[transformer.YAxis].Min.y),
                  (float)((bounds_max->x - dVar15) * GImPlot->Mx +
                         (double)GImPlot->PixelRange[transformer.YAxis].Min.x));
    col = GetColormapColorU32(0,(GImPlot->Style).Colormap);
    ImDrawList::AddRectFilled(DrawList,(ImVec2 *)&local_b8,(ImVec2 *)&local_d8,col,0.0,0);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}